

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::emitMessages
               (DebugMessageTestContext *ctx,GLenum source)

{
  uint type;
  GLuint id;
  char *pcVar1;
  long lVar2;
  allocator<char> local_b9;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (local_b8 = 0; local_b8 != 9; local_b8 = local_b8 + 1) {
    type = (&Functional::(anonymous_namespace)::s_debugTypes)[local_b8];
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      id = *(GLuint *)((long)&Functional::(anonymous_namespace)::s_debugSeverities + lVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Application generated message with type ",&local_b9);
      pcVar1 = glu::getDebugMessageTypeName(type);
      std::operator+(&local_70,&local_b0,pcVar1);
      std::operator+(&local_50,&local_70," and severity ");
      pcVar1 = glu::getDebugMessageSeverityName(id);
      std::operator+(&msg,&local_50,pcVar1);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      glu::CallLogWrapper::glDebugMessageInsert
                ((CallLogWrapper *)ctx,source,type,id,id,-1,msg._M_dataplus._M_p);
      (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[6])(ctx->m_debugHost,source,(ulong)type);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void emitMessages (DebugMessageTestContext& ctx, GLenum source)
{
	for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_debugTypes); typeNdx++)
	{
		for (int severityNdx = 0; severityNdx < DE_LENGTH_OF_ARRAY(s_debugSeverities); severityNdx++)
		{
			const GLenum type		= s_debugTypes[typeNdx];
			const GLenum severity	= s_debugSeverities[severityNdx];
			const string msg		= string("Application generated message with type ") + glu::getDebugMessageTypeName(type)
									  + " and severity " + glu::getDebugMessageSeverityName(severity);

			// Use severity as ID, guaranteed unique
			ctx.glDebugMessageInsert(source, type, severity, severity, -1, msg.c_str());
			ctx.expectMessage(source, type);
		}
	}
}